

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebm_util.cc
# Opt level: O3

bool libwebm::ParseVP9SuperFrameIndex
               (uint8_t *frame,size_t frame_length,Ranges *frame_ranges,bool *error)

{
  pointer *ppRVar1;
  byte bVar2;
  byte bVar3;
  iterator __position;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  byte *pbVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  byte *pbVar12;
  size_t sVar13;
  bool bVar14;
  Range local_40;
  
  if ((error != (bool *)0x0 && frame_ranges != (Ranges *)0x0) &&
      (frame_length != 0 && frame != (uint8_t *)0x0)) {
    bVar2 = frame[frame_length - 1];
    if ((bVar2 & 0xe0) == 0xc0) {
      iVar10 = (bVar2 & 7) + 1;
      uVar7 = (ulong)(((bVar2 >> 3 & 3) + 1) * iVar10 + 2);
      uVar11 = frame_length - uVar7;
      if (frame_length < uVar7) {
        ParseVP9SuperFrameIndex();
      }
      else if ((uVar11 < uVar7) || (frame[uVar11] != bVar2)) {
        ParseVP9SuperFrameIndex();
      }
      else {
        pbVar12 = frame + uVar11 + 1;
        uVar4 = bVar2 >> 3 & 3;
        sVar13 = 0;
        uVar9 = 0;
        do {
          iVar6 = 0;
          uVar5 = 0;
          pbVar8 = pbVar12;
          do {
            bVar3 = *pbVar8;
            pbVar8 = pbVar8 + 1;
            uVar5 = uVar5 | (uint)bVar3 << ((byte)iVar6 & 0x1f);
            iVar6 = iVar6 + 8;
          } while (uVar4 * 8 + 8 != iVar6);
          uVar7 = (ulong)uVar5;
          if (uVar11 - sVar13 < uVar7) {
            ParseVP9SuperFrameIndex();
            goto LAB_0010bef1;
          }
          __position._M_current =
               (frame_ranges->super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          local_40.offset = sVar13;
          local_40.length = uVar7;
          if (__position._M_current ==
              (frame_ranges->super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::
            _M_realloc_insert<libwebm::Range>(frame_ranges,__position,&local_40);
          }
          else {
            (__position._M_current)->offset = sVar13;
            (__position._M_current)->length = uVar7;
            ppRVar1 = &(frame_ranges->
                       super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppRVar1 = *ppRVar1 + 1;
          }
          pbVar12 = pbVar12 + (ulong)uVar4 + 1;
          sVar13 = sVar13 + uVar7;
          bVar14 = uVar9 != (bVar2 & 7);
          uVar9 = uVar9 + 1;
        } while (bVar14);
        if (iVar10 == (int)((ulong)((long)(frame_ranges->
                                          super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(frame_ranges->
                                         super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          return true;
        }
        ParseVP9SuperFrameIndex();
      }
LAB_0010bef1:
      *error = true;
    }
  }
  return false;
}

Assistant:

bool ParseVP9SuperFrameIndex(const std::uint8_t* frame,
                             std::size_t frame_length, Ranges* frame_ranges,
                             bool* error) {
  if (frame == nullptr || frame_length == 0 || frame_ranges == nullptr ||
      error == nullptr) {
    return false;
  }

  bool parse_ok = false;
  const std::uint8_t marker = frame[frame_length - 1];
  const std::uint32_t kHasSuperFrameIndexMask = 0xe0;
  const std::uint32_t kSuperFrameMarker = 0xc0;
  const std::uint32_t kLengthFieldSizeMask = 0x3;

  if ((marker & kHasSuperFrameIndexMask) == kSuperFrameMarker) {
    const std::uint32_t kFrameCountMask = 0x7;
    const int num_frames = (marker & kFrameCountMask) + 1;
    const int length_field_size = ((marker >> 3) & kLengthFieldSizeMask) + 1;
    const std::size_t index_length = 2 + length_field_size * num_frames;

    if (frame_length < index_length) {
      std::fprintf(stderr,
                   "VP9ParseSuperFrameIndex: Invalid superframe index size.\n");
      *error = true;
      return false;
    }

    // Consume the super frame index. Note: it's at the end of the super frame.
    const std::size_t length = frame_length - index_length;

    if (length >= index_length &&
        frame[frame_length - index_length] == marker) {
      // Found a valid superframe index.
      const std::uint8_t* byte = frame + length + 1;

      std::size_t frame_offset = 0;

      for (int i = 0; i < num_frames; ++i) {
        std::uint32_t child_frame_length = 0;

        for (int j = 0; j < length_field_size; ++j) {
          child_frame_length |= (*byte++) << (j * 8);
        }

        if (length - frame_offset < child_frame_length) {
          std::fprintf(stderr,
                       "ParseVP9SuperFrameIndex: Invalid superframe, sub frame "
                       "larger than entire frame.\n");
          *error = true;
          return false;
        }

        frame_ranges->push_back(Range(frame_offset, child_frame_length));
        frame_offset += child_frame_length;
      }

      if (static_cast<int>(frame_ranges->size()) != num_frames) {
        std::fprintf(stderr, "VP9Parse: superframe index parse failed.\n");
        *error = true;
        return false;
      }

      parse_ok = true;
    } else {
      std::fprintf(stderr, "VP9Parse: Invalid superframe index.\n");
      *error = true;
    }
  }
  return parse_ok;
}